

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O2

string * __thiscall
antlr::BaseAST::toStringList_abi_cxx11_(string *__return_storage_ptr__,BaseAST *this)

{
  AST *pAVar1;
  ASTRefCount<antlr::AST> *this_00;
  ASTRefCount<antlr::AST> local_40;
  ASTRefCount<antlr::AST> local_38 [4];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)local_38);
  (*(this->super_AST)._vptr_AST[0xd])(local_38,this);
  if (local_38[0].ref == (ASTRef *)0x0) {
    ASTRefCount<antlr::AST>::~ASTRefCount(local_38);
  }
  else {
    pAVar1 = (local_38[0].ref)->ptr;
    ASTRefCount<antlr::AST>::~ASTRefCount(local_38);
    if (pAVar1 != (AST *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      (*(this->super_AST)._vptr_AST[0x18])(local_38,this);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_38);
      (*(this->super_AST)._vptr_AST[0xd])(&local_40,this);
      (*(local_40.ref)->ptr->_vptr_AST[0x19])(local_38);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_38);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_40);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_0015eed8;
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (*(this->super_AST)._vptr_AST[0x18])(local_38,this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_38);
LAB_0015eed8:
  (*(this->super_AST)._vptr_AST[0xe])(local_38,this);
  if (local_38[0].ref == (ASTRef *)0x0) {
    this_00 = local_38;
  }
  else {
    pAVar1 = (local_38[0].ref)->ptr;
    ASTRefCount<antlr::AST>::~ASTRefCount(local_38);
    if (pAVar1 == (AST *)0x0) {
      return __return_storage_ptr__;
    }
    (*(this->super_AST)._vptr_AST[0xe])(&local_40,this);
    (*(local_40.ref)->ptr->_vptr_AST[0x19])(local_38);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_38);
    this_00 = &local_40;
  }
  ASTRefCount<antlr::AST>::~ASTRefCount(this_00);
  return __return_storage_ptr__;
}

Assistant:

string BaseAST::toStringList() const
{
	ANTLR_USE_NAMESPACE(std)string ts="";

	if (getFirstChild())
	{
		ts+=" ( ";
		ts+=toString();
		ts+=getFirstChild()->toStringList();
		ts+=" )";
	}
	else
	{
		ts+=" ";
		ts+=toString();
	}

	if (getNextSibling())
		ts+=getNextSibling()->toStringList();

	return ts;
}